

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-netpack.c
# Opt level: O0

uncomplete * find_uncomplete(queue *q,int fd)

{
  int iVar1;
  queue *local_30;
  uncomplete *last;
  uncomplete *uc;
  int h;
  int fd_local;
  queue *q_local;
  
  if (q == (queue *)0x0) {
    q_local = (queue *)0x0;
  }
  else {
    iVar1 = hash_fd(fd);
    q_local = (queue *)q->hash[iVar1];
    if (q_local == (queue *)0x0) {
      q_local = (queue *)0x0;
    }
    else if (((netpack *)&q_local->cap)->id == fd) {
      q->hash[iVar1] = q_local->hash[0];
    }
    else {
      do {
        local_30 = q_local;
        if (local_30->hash[0] == (uncomplete *)0x0) {
          return (uncomplete *)0x0;
        }
        q_local = (queue *)local_30->hash[0];
      } while (((netpack *)&q_local->cap)->id != fd);
      local_30->hash[0] = q_local->hash[0];
    }
  }
  return (uncomplete *)q_local;
}

Assistant:

static struct uncomplete *
find_uncomplete(struct queue *q, int fd) {
	if (q == NULL)
		return NULL;
	int h = hash_fd(fd);
	struct uncomplete * uc = q->hash[h];
	if (uc == NULL)
		return NULL;
	if (uc->pack.id == fd) {
		q->hash[h] = uc->next;
		return uc;
	}
	struct uncomplete * last = uc;
	while (last->next) {
		uc = last->next;
		if (uc->pack.id == fd) {
			last->next = uc->next;
			return uc;
		}
		last = uc;
	}
	return NULL;
}